

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

String * __thiscall Process::readAllStdErr(String *__return_storage_ptr__,Process *this)

{
  (__return_storage_ptr__->mString)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mString).field_2;
  (__return_storage_ptr__->mString)._M_string_length = 0;
  (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  std::swap<String>(&this->mStdErrBuffer,__return_storage_ptr__);
  this->mStdErrIndex = 0;
  return __return_storage_ptr__;
}

Assistant:

String Process::readAllStdErr()
{
    String out;
    std::swap(mStdErrBuffer, out);
    mStdErrIndex = 0;
    return out;
}